

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O0

int main(void)

{
  wchar_t wVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  wchar_t *pwVar5;
  runtime_error *prVar6;
  input_char *piVar7;
  long lVar8;
  long lVar9;
  input_char_conflict *piVar10;
  output_char_conflict *poVar11;
  exception *e;
  string local_3a68 [32];
  ostringstream local_3a48 [8];
  ostringstream ss_34;
  string local_38c8 [32];
  ostringstream local_38a8 [8];
  ostringstream ss_33;
  string local_3728 [32];
  ostringstream local_3708 [8];
  ostringstream ss_32;
  string local_3588 [32];
  ostringstream local_3568 [8];
  ostringstream ss_31;
  undefined1 local_33f0 [8];
  basic_stackstring<char,_wchar_t,_10UL> sw_3;
  string local_33d0 [32];
  ostringstream local_33b0 [8];
  ostringstream ss_30;
  string local_3230 [32];
  ostringstream local_3210 [8];
  ostringstream ss_29;
  string local_3090 [32];
  ostringstream local_3070 [8];
  ostringstream ss_28;
  string local_2ef0 [32];
  ostringstream local_2ed0 [8];
  ostringstream ss_27;
  undefined1 local_2d58 [8];
  basic_stackstring<char,_wchar_t,_5UL> sw_2;
  string local_2d40 [32];
  ostringstream local_2d20 [8];
  ostringstream ss_26;
  string local_2ba0 [32];
  ostringstream local_2b80 [8];
  ostringstream ss_25;
  string local_2a00 [32];
  ostringstream local_29e0 [8];
  ostringstream ss_24;
  string local_2860 [32];
  ostringstream local_2840 [8];
  ostringstream ss_23;
  undefined1 local_26c8 [8];
  basic_stackstring<wchar_t,_char,_5UL> sw_1;
  string local_26a0 [32];
  ostringstream local_2680 [8];
  ostringstream ss_22;
  string local_2500 [32];
  ostringstream local_24e0 [8];
  ostringstream ss_21;
  string local_2360 [32];
  ostringstream local_2340 [8];
  ostringstream ss_20;
  string local_21c0 [32];
  ostringstream local_21a0 [8];
  ostringstream ss_19;
  undefined1 local_2028 [8];
  basic_stackstring<wchar_t,_char,_3UL> sw;
  string local_2008 [32];
  ostringstream local_1fe8 [8];
  ostringstream ss_18;
  allocator<wchar_t> local_1e69;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1e68;
  undefined1 local_1e41;
  string local_1e40 [32];
  ostringstream local_1e20 [8];
  ostringstream ss_17;
  allocator<char> local_1ca1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ca0;
  wchar_t local_1c80 [2];
  wchar_t wbuf [3];
  char buf_2 [3];
  ostringstream local_1c50 [8];
  ostringstream ss_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad8;
  undefined1 local_1ab1;
  string local_1ab0 [32];
  ostringstream local_1a90 [8];
  ostringstream ss_15;
  string local_1910 [32];
  ostringstream local_18f0 [8];
  ostringstream ss_14;
  string local_1770 [32];
  ostringstream local_1750 [8];
  ostringstream ss_13;
  string local_15d0 [32];
  ostringstream local_15b0 [8];
  ostringstream ss_12;
  string local_1430 [32];
  ostringstream local_1410 [8];
  ostringstream ss_11;
  char local_1292 [8];
  char buf_1 [10];
  wchar_t *e_2;
  wchar_t *b_1;
  string local_1270 [32];
  ostringstream local_1250 [8];
  ostringstream ss_10;
  string local_10d0 [32];
  ostringstream local_10b0 [8];
  ostringstream ss_9;
  string local_f30 [32];
  ostringstream local_f10 [8];
  ostringstream ss_8;
  string local_d90 [32];
  ostringstream local_d70 [8];
  ostringstream ss_7;
  string local_bf0 [32];
  ostringstream local_bd0 [8];
  ostringstream ss_6;
  string local_a50 [32];
  ostringstream local_a30 [8];
  ostringstream ss_5;
  string local_8b0 [32];
  ostringstream local_890 [8];
  ostringstream ss_4;
  string local_710 [32];
  ostringstream local_6f0 [8];
  ostringstream ss_3;
  string local_570 [32];
  ostringstream local_550 [8];
  ostringstream ss_2;
  string local_3d0 [32];
  ostringstream local_3b0 [8];
  ostringstream ss_1;
  string local_230 [32];
  ostringstream local_210 [8];
  ostringstream ss;
  wchar_t local_98;
  int iStack_94;
  wchar_t buf [6];
  char *e_1;
  char *b;
  undefined1 local_68 [8];
  wstring whello;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string hello;
  
  hello.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,anon_var_dwarf_3b53,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_68,L"שלום",(allocator<wchar_t> *)((long)&b + 7));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&b + 7));
  poVar3 = std::operator<<((ostream *)&std::cout,"- nowide::widen");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  buf._16_8_ = pcVar4 + 8;
  _local_98 = 0;
  buf[0] = L'\0';
  buf[1] = L'\0';
  buf[2] = L'\0';
  buf[3] = L'\x01';
  pwVar5 = boost::nowide::widen(&local_98,5,pcVar4,(char *)buf._16_8_);
  if (pwVar5 != &local_98) {
    std::__cxx11::ostringstream::ostringstream(local_210);
    poVar3 = std::operator<<((ostream *)local_210,"Error nowide::widen(buf,5,b,e)==buf in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1a);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_230);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==(&local_98,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_68);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_3b0);
    poVar3 = std::operator<<((ostream *)local_3b0,"Error buf == whello in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3d0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (buf[3] != L'\x01') {
    std::__cxx11::ostringstream::ostringstream(local_550);
    poVar3 = std::operator<<((ostream *)local_550,"Error buf[5] == 1 in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_570);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = boost::nowide::widen(&local_98,4,pcVar4,(char *)buf._16_8_);
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_6f0);
    poVar3 = std::operator<<((ostream *)local_6f0,"Error nowide::widen(buf,4,b,e)==0 in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_710);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = boost::nowide::widen(&local_98,5,pcVar4,(char *)(buf._16_8_ + -1));
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_890);
    poVar3 = std::operator<<((ostream *)local_890,"Error nowide::widen(buf,5,b,e-1)==0 in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1e);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_8b0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = boost::nowide::widen(&local_98,5,pcVar4,(char *)(buf._16_8_ + -2));
  if (pwVar5 != &local_98) {
    std::__cxx11::ostringstream::ostringstream(local_a30);
    poVar3 = std::operator<<((ostream *)local_a30,"Error nowide::widen(buf,5,b,e-2)==buf in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1f);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_a50);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = boost::nowide::widen(&local_98,5,pcVar4,pcVar4);
  if ((pwVar5 != &local_98) || (local_98 != L'\0')) {
    std::__cxx11::ostringstream::ostringstream(local_bd0);
    poVar3 = std::operator<<((ostream *)local_bd0,
                             "Error nowide::widen(buf,5,b,b)==buf && buf[0]==0 in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_bf0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = boost::nowide::widen(&local_98,5,pcVar4,pcVar4 + 2);
  if ((pwVar5 == &local_98) && (iStack_94 == 0)) {
    wVar1 = local_98;
    pwVar5 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_68);
    if (wVar1 == *pwVar5) {
      buf._16_8_ = anon_var_dwarf_3c91 + 2;
      pwVar5 = boost::nowide::widen(&local_98,5,anon_var_dwarf_3c91,anon_var_dwarf_3c91 + 2);
      if (pwVar5 != (wchar_t *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_f10);
        poVar3 = std::operator<<((ostream *)local_f10,"Error nowide::widen(buf,5,b,e)==0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_f30);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      buf._16_8_ = anon_var_dwarf_3cb1 + 3;
      pwVar5 = boost::nowide::widen(&local_98,5,anon_var_dwarf_3cb1,anon_var_dwarf_3cb1 + 3);
      if (pwVar5 != (wchar_t *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_10b0);
        poVar3 = std::operator<<((ostream *)local_10b0,"Error nowide::widen(buf,5,b,e)==0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_10d0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar5 = boost::nowide::widen(&local_98,5,anon_var_dwarf_3cb1,anon_var_dwarf_3cb1 + 1);
      if (pwVar5 != (wchar_t *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1250);
        poVar3 = std::operator<<((ostream *)local_1250,"Error nowide::widen(buf,5,b,b+1)==0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_1270);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"- nowide::narrow");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pwVar5 = (wchar_t *)std::__cxx11::wstring::c_str();
      buf_1._2_8_ = pwVar5 + 4;
      memset(local_1292,0,10);
      buf_1[1] = '\x01';
      pcVar4 = boost::nowide::narrow(local_1292,9,pwVar5,(wchar_t *)buf_1._2_8_);
      if (pcVar4 != local_1292) {
        std::__cxx11::ostringstream::ostringstream(local_1410);
        poVar3 = std::operator<<((ostream *)local_1410,"Error nowide::narrow(buf,9,b,e)==buf in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_1430);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = std::operator==(local_1292,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_15b0);
        poVar3 = std::operator<<((ostream *)local_15b0,"Error buf == hello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x31);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_15d0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (buf_1[1] != '\x01') {
        std::__cxx11::ostringstream::ostringstream(local_1750);
        poVar3 = std::operator<<((ostream *)local_1750,"Error buf[9] == 1 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x32);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_1770);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = boost::nowide::narrow(local_1292,8,pwVar5,(wchar_t *)buf_1._2_8_);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_18f0);
        poVar3 = std::operator<<((ostream *)local_18f0,"Error nowide::narrow(buf,8,b,e)==0 in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_1910);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = boost::nowide::narrow(local_1292,7,pwVar5,(wchar_t *)(buf_1._2_8_ + -4));
      if (pcVar4 != local_1292) {
        std::__cxx11::ostringstream::ostringstream(local_1a90);
        poVar3 = std::operator<<((ostream *)local_1a90,"Error nowide::narrow(buf,7,b,e-1)==buf in ")
        ;
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x34);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        local_1ab1 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_1ab0);
        local_1ab1 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)&local_1ad8,(ulong)local_30);
      bVar2 = std::operator==(local_1292,&local_1ad8);
      std::__cxx11::string::~string((string *)&local_1ad8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1c50);
        poVar3 = std::operator<<((ostream *)local_1c50,"Error buf==hello.substr(0,6) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x35);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        wbuf[1]._3_1_ = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,(string *)(wbuf + 2));
        wbuf[1]._3_1_ = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = boost::nowide::narrow((char *)(wbuf + 1),3,L"xy");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ca0,"xy",&local_1ca1);
      bVar2 = std::operator==(pcVar4,&local_1ca0);
      std::__cxx11::string::~string((string *)&local_1ca0);
      std::allocator<char>::~allocator(&local_1ca1);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1e20);
        poVar3 = std::operator<<((ostream *)local_1e20,
                                 "Error nowide::narrow(buf,3,L\"xy\")==std::string(\"xy\") in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3a);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        local_1e41 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_1e40);
        local_1e41 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar5 = boost::nowide::widen(local_1c80,3,"xy");
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_1e68,L"xy",&local_1e69);
      bVar2 = std::operator==(pwVar5,&local_1e68);
      std::__cxx11::wstring::~wstring((wstring *)&local_1e68);
      std::allocator<wchar_t>::~allocator(&local_1e69);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1fe8);
        poVar3 = std::operator<<((ostream *)local_1fe8,
                                 "Error nowide::widen(wbuf,3,\"xy\")==std::wstring(L\"xy\") in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3b);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        sw.mem_buffer_._7_1_ = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2008);
        sw.mem_buffer_._7_1_ = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"- nowide::stackstring");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      boost::nowide::basic_stackstring<wchar_t,_char,_3UL>::basic_stackstring
                ((basic_stackstring<wchar_t,_char,_3UL> *)local_2028);
      piVar7 = (input_char *)std::__cxx11::string::c_str();
      bVar2 = boost::nowide::basic_stackstring<wchar_t,_char,_3UL>::convert
                        ((basic_stackstring<wchar_t,_char,_3UL> *)local_2028,piVar7);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_21a0);
        poVar3 = std::operator<<((ostream *)local_21a0,"Error sw.convert(hello.c_str()) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x41);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_21c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar5 = boost::nowide::basic_stackstring<wchar_t,_char,_3UL>::c_str
                         ((basic_stackstring<wchar_t,_char,_3UL> *)local_2028);
      bVar2 = std::operator==(pwVar5,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                      *)local_68);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_2340);
        poVar3 = std::operator<<((ostream *)local_2340,"Error sw.c_str() == whello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2360);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar7 = (input_char *)std::__cxx11::string::c_str();
      lVar8 = std::__cxx11::string::c_str();
      lVar9 = std::__cxx11::string::size();
      bVar2 = boost::nowide::basic_stackstring<wchar_t,_char,_3UL>::convert
                        ((basic_stackstring<wchar_t,_char,_3UL> *)local_2028,piVar7,
                         (input_char *)(lVar8 + lVar9));
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_24e0);
        poVar3 = std::operator<<((ostream *)local_24e0,
                                 "Error sw.convert(hello.c_str(),hello.c_str()+hello.size()) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2500);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar5 = boost::nowide::basic_stackstring<wchar_t,_char,_3UL>::c_str
                         ((basic_stackstring<wchar_t,_char,_3UL> *)local_2028);
      bVar2 = std::operator==(pwVar5,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                      *)local_68);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_2680);
        poVar3 = std::operator<<((ostream *)local_2680,"Error sw.c_str() == whello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x44);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        sw_1.mem_buffer_._7_1_ = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_26a0);
        sw_1.mem_buffer_._7_1_ = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      boost::nowide::basic_stackstring<wchar_t,_char,_3UL>::~basic_stackstring
                ((basic_stackstring<wchar_t,_char,_3UL> *)local_2028);
      boost::nowide::basic_stackstring<wchar_t,_char,_5UL>::basic_stackstring
                ((basic_stackstring<wchar_t,_char,_5UL> *)local_26c8);
      piVar7 = (input_char *)std::__cxx11::string::c_str();
      bVar2 = boost::nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
                        ((basic_stackstring<wchar_t,_char,_5UL> *)local_26c8,piVar7);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_2840);
        poVar3 = std::operator<<((ostream *)local_2840,"Error sw.convert(hello.c_str()) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x48);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2860);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar5 = boost::nowide::basic_stackstring<wchar_t,_char,_5UL>::c_str
                         ((basic_stackstring<wchar_t,_char,_5UL> *)local_26c8);
      bVar2 = std::operator==(pwVar5,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                      *)local_68);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_29e0);
        poVar3 = std::operator<<((ostream *)local_29e0,"Error sw.c_str() == whello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x49);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2a00);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar7 = (input_char *)std::__cxx11::string::c_str();
      lVar8 = std::__cxx11::string::c_str();
      lVar9 = std::__cxx11::string::size();
      bVar2 = boost::nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
                        ((basic_stackstring<wchar_t,_char,_5UL> *)local_26c8,piVar7,
                         (input_char *)(lVar8 + lVar9));
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_2b80);
        poVar3 = std::operator<<((ostream *)local_2b80,
                                 "Error sw.convert(hello.c_str(),hello.c_str()+hello.size()) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2ba0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar5 = boost::nowide::basic_stackstring<wchar_t,_char,_5UL>::c_str
                         ((basic_stackstring<wchar_t,_char,_5UL> *)local_26c8);
      bVar2 = std::operator==(pwVar5,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                      *)local_68);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_2d20);
        poVar3 = std::operator<<((ostream *)local_2d20,"Error sw.c_str() == whello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4b);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        sw_2.mem_buffer_._7_1_ = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2d40);
        sw_2.mem_buffer_._7_1_ = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      boost::nowide::basic_stackstring<wchar_t,_char,_5UL>::~basic_stackstring
                ((basic_stackstring<wchar_t,_char,_5UL> *)local_26c8);
      boost::nowide::basic_stackstring<char,_wchar_t,_5UL>::basic_stackstring
                ((basic_stackstring<char,_wchar_t,_5UL> *)local_2d58);
      piVar10 = (input_char_conflict *)std::__cxx11::wstring::c_str();
      bVar2 = boost::nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
                        ((basic_stackstring<char,_wchar_t,_5UL> *)local_2d58,piVar10);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_2ed0);
        poVar3 = std::operator<<((ostream *)local_2ed0,"Error sw.convert(whello.c_str()) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4f);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_2ef0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar11 = boost::nowide::basic_stackstring<char,_wchar_t,_5UL>::c_str
                          ((basic_stackstring<char,_wchar_t,_5UL> *)local_2d58);
      bVar2 = std::operator==(poVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_3070);
        poVar3 = std::operator<<((ostream *)local_3070,"Error sw.c_str() == hello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3090);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar10 = (input_char_conflict *)std::__cxx11::wstring::c_str();
      lVar8 = std::__cxx11::wstring::c_str();
      lVar9 = std::__cxx11::wstring::size();
      bVar2 = boost::nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
                        ((basic_stackstring<char,_wchar_t,_5UL> *)local_2d58,piVar10,
                         (input_char_conflict *)(lVar8 + lVar9 * 4));
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_3210);
        poVar3 = std::operator<<((ostream *)local_3210,
                                 "Error sw.convert(whello.c_str(),whello.c_str()+whello.size()) in "
                                );
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x51);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3230);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar11 = boost::nowide::basic_stackstring<char,_wchar_t,_5UL>::c_str
                          ((basic_stackstring<char,_wchar_t,_5UL> *)local_2d58);
      bVar2 = std::operator==(poVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_33b0);
        poVar3 = std::operator<<((ostream *)local_33b0,"Error sw.c_str() == hello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        sw_3.mem_buffer_._7_1_ = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_33d0);
        sw_3.mem_buffer_._7_1_ = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      boost::nowide::basic_stackstring<char,_wchar_t,_5UL>::~basic_stackstring
                ((basic_stackstring<char,_wchar_t,_5UL> *)local_2d58);
      boost::nowide::basic_stackstring<char,_wchar_t,_10UL>::basic_stackstring
                ((basic_stackstring<char,_wchar_t,_10UL> *)local_33f0);
      piVar10 = (input_char_conflict *)std::__cxx11::wstring::c_str();
      bVar2 = boost::nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
                        ((basic_stackstring<char,_wchar_t,_10UL> *)local_33f0,piVar10);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_3568);
        poVar3 = std::operator<<((ostream *)local_3568,"Error sw.convert(whello.c_str()) in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x56);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3588);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar11 = boost::nowide::basic_stackstring<char,_wchar_t,_10UL>::c_str
                          ((basic_stackstring<char,_wchar_t,_10UL> *)local_33f0);
      bVar2 = std::operator==(poVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_3708);
        poVar3 = std::operator<<((ostream *)local_3708,"Error sw.c_str() == hello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x57);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3728);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar10 = (input_char_conflict *)std::__cxx11::wstring::c_str();
      lVar8 = std::__cxx11::wstring::c_str();
      lVar9 = std::__cxx11::wstring::size();
      bVar2 = boost::nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
                        ((basic_stackstring<char,_wchar_t,_10UL> *)local_33f0,piVar10,
                         (input_char_conflict *)(lVar8 + lVar9 * 4));
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_38a8);
        poVar3 = std::operator<<((ostream *)local_38a8,
                                 "Error sw.convert(whello.c_str(),whello.c_str()+whello.size()) in "
                                );
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x58);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_38c8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar11 = boost::nowide::basic_stackstring<char,_wchar_t,_10UL>::c_str
                          ((basic_stackstring<char,_wchar_t,_10UL> *)local_33f0);
      bVar2 = std::operator==(poVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_3a48);
        poVar3 = std::operator<<((ostream *)local_3a48,"Error sw.c_str() == hello in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                                );
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x59);
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,"main");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3a68);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      boost::nowide::basic_stackstring<char,_wchar_t,_10UL>::~basic_stackstring
                ((basic_stackstring<char,_wchar_t,_10UL> *)local_33f0);
      std::__cxx11::wstring::~wstring((wstring *)local_68);
      std::__cxx11::string::~string((string *)local_30);
      poVar3 = std::operator<<((ostream *)&std::cout,"Passed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_d70);
  poVar3 = std::operator<<((ostream *)local_d70,
                           "Error nowide::widen(buf,5,b,b+2)==buf && buf[1]==0 && buf[0]==whello[0] in "
                          );
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_convert.cpp"
                          );
  poVar3 = std::operator<<(poVar3,':');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x21);
  poVar3 = std::operator<<(poVar3," ");
  std::operator<<(poVar3,"main");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar6,local_d90);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string hello = "\xd7\xa9\xd7\x9c\xd7\x95\xd7\x9d";
        std::wstring whello = L"\u05e9\u05dc\u05d5\u05dd";
        std::cout << "- nowide::widen" << std::endl;
        {
            char const *b=hello.c_str();
            char const *e=b+8;
            wchar_t buf[6] = { 0,0,0,0,0,1 };
            TEST(nowide::widen(buf,5,b,e)==buf);
            TEST(buf == whello);
            TEST(buf[5] == 1);
            TEST(nowide::widen(buf,4,b,e)==0);
            TEST(nowide::widen(buf,5,b,e-1)==0);
            TEST(nowide::widen(buf,5,b,e-2)==buf);
            TEST(nowide::widen(buf,5,b,b)==buf && buf[0]==0);
            TEST(nowide::widen(buf,5,b,b+2)==buf && buf[1]==0 && buf[0]==whello[0]);
            b="\xFF\xFF";
            e=b+2;
            TEST(nowide::widen(buf,5,b,e)==0);
            b="\xd7\xa9\xFF";
            e=b+3;
            TEST(nowide::widen(buf,5,b,e)==0);
            TEST(nowide::widen(buf,5,b,b+1)==0);
        }
        std::cout << "- nowide::narrow" << std::endl;
        {
            wchar_t const *b=whello.c_str();
            wchar_t const *e=b+4;
            char buf[10] = {0};
            buf[9]=1;
            TEST(nowide::narrow(buf,9,b,e)==buf);
            TEST(buf == hello);
            TEST(buf[9] == 1);
            TEST(nowide::narrow(buf,8,b,e)==0);
            TEST(nowide::narrow(buf,7,b,e-1)==buf);
            TEST(buf==hello.substr(0,6));
        }
        {
            char buf[3];
            wchar_t wbuf[3];
            TEST(nowide::narrow(buf,3,L"xy")==std::string("xy"));
            TEST(nowide::widen(wbuf,3,"xy")==std::wstring(L"xy"));
        }
        std::cout << "- nowide::stackstring" << std::endl;
        {
            {
                nowide::basic_stackstring<wchar_t,char,3> sw;
                TEST(sw.convert(hello.c_str()));
                TEST(sw.c_str() == whello);
                TEST(sw.convert(hello.c_str(),hello.c_str()+hello.size()));
                TEST(sw.c_str() == whello);
            }
            {
                nowide::basic_stackstring<wchar_t,char,5> sw;
                TEST(sw.convert(hello.c_str()));
                TEST(sw.c_str() == whello);
                TEST(sw.convert(hello.c_str(),hello.c_str()+hello.size()));
                TEST(sw.c_str() == whello);
            }
            {
                nowide::basic_stackstring<char,wchar_t,5> sw;
                TEST(sw.convert(whello.c_str()));
                TEST(sw.c_str() == hello);
                TEST(sw.convert(whello.c_str(),whello.c_str()+whello.size()));
                TEST(sw.c_str() == hello);
            }
            {
                nowide::basic_stackstring<char,wchar_t,10> sw;
                TEST(sw.convert(whello.c_str()));
                TEST(sw.c_str() == hello);
                TEST(sw.convert(whello.c_str(),whello.c_str()+whello.size()));
                TEST(sw.c_str() == hello);
            }
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Failed :" << e.what() << std::endl;
        return 1;
    }
    std::cout << "Passed" << std::endl;
    return 0;
}